

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

void Imath_3_2::extractEulerXYZ<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  uint extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vec3<float> local_80;
  Vec3<float> local_70;
  float local_64;
  Vec3<float> local_60;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  float local_18;
  uint uStack_14;
  uint uStack_10;
  uint uStack_c;
  
  local_60.z = mat->x[0][2];
  uVar5 = 0;
  local_60._0_8_ = *(undefined8 *)mat->x[0];
  local_70.z = mat->x[1][2];
  local_70._0_8_ = *(undefined8 *)mat->x[1];
  local_80.z = mat->x[2][2];
  local_80._0_8_ = *(undefined8 *)mat->x[2];
  fVar3 = (float)((ulong)local_60._0_8_ >> 0x20);
  fVar3 = local_60.z * local_60.z + (float)local_60._0_8_ * (float)local_60._0_8_ + fVar3 * fVar3;
  if (fVar3 < 2.3509887e-38) {
    fVar3 = Vec3<float>::lengthTiny(&local_60);
    uVar5 = extraout_XMM0_Db_03;
  }
  else if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
    uVar5 = extraout_XMM0_Db;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar7._8_8_ = 0;
    auVar7._0_4_ = local_60.x;
    auVar7._4_4_ = local_60.y;
    auVar8._4_4_ = fVar3;
    auVar8._0_4_ = fVar3;
    auVar8._8_4_ = uVar5;
    auVar8._12_4_ = uVar5;
    auVar8 = divps(auVar7,auVar8);
    local_60._0_8_ = auVar8._0_8_;
    local_60.z = local_60.z / fVar3;
  }
  uVar5 = 0;
  fVar3 = local_70.z * local_70.z + local_70.x * local_70.x + local_70.y * local_70.y;
  if (fVar3 < 2.3509887e-38) {
    fVar3 = Vec3<float>::lengthTiny(&local_70);
    uVar5 = extraout_XMM0_Db_04;
  }
  else if (0.0 <= fVar3) {
    fVar3 = SQRT(fVar3);
  }
  else {
    fVar3 = sqrtf(fVar3);
    uVar5 = extraout_XMM0_Db_00;
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar9._8_8_ = 0;
    auVar9._0_4_ = local_70.x;
    auVar9._4_4_ = local_70.y;
    auVar1._4_4_ = fVar3;
    auVar1._0_4_ = fVar3;
    auVar1._8_4_ = uVar5;
    auVar1._12_4_ = uVar5;
    auVar8 = divps(auVar9,auVar1);
    local_70._0_8_ = auVar8._0_8_;
    local_70.z = local_70.z / fVar3;
  }
  uVar5 = 0;
  fVar3 = local_80.z * local_80.z + local_80.x * local_80.x + local_80.y * local_80.y;
  if (fVar3 < 2.3509887e-38) {
    fVar3 = Vec3<float>::lengthTiny(&local_80);
    uVar5 = extraout_XMM0_Db_05;
  }
  else if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
    uVar5 = extraout_XMM0_Db_01;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    auVar10._8_8_ = 0;
    auVar10._0_4_ = local_80.x;
    auVar10._4_4_ = local_80.y;
    auVar2._4_4_ = fVar3;
    auVar2._0_4_ = fVar3;
    auVar2._8_4_ = uVar5;
    auVar2._12_4_ = uVar5;
    auVar8 = divps(auVar10,auVar2);
    local_80._0_8_ = auVar8._0_8_;
    local_80.z = local_80.z / fVar3;
  }
  local_48 = local_60.x;
  local_64 = local_60.y;
  local_4c = local_70.x;
  local_44 = local_70.y;
  local_28 = ZEXT416((uint)local_80.x);
  local_40 = local_80.y;
  local_38 = ZEXT416((uint)local_80.z);
  local_3c = local_70.z * 0.0 + local_60.z;
  local_18 = atan2f(local_70.z,local_80.z);
  rot->x = local_18;
  local_18 = -local_18;
  uStack_14 = extraout_XMM0_Db_02 ^ 0x80000000;
  uStack_10 = extraout_XMM0_Dc ^ 0x80000000;
  uStack_c = extraout_XMM0_Dd ^ 0x80000000;
  local_50 = cosf(local_18);
  fVar3 = sinf(local_18);
  fVar4 = fVar3 * 0.0;
  fVar6 = local_50 * -0.0 + fVar4;
  fVar12 = (local_50 + fVar4) * 0.0;
  fVar11 = fVar6 + fVar12 + fVar4;
  fVar6 = fVar6 * 0.0;
  fVar14 = local_50 + fVar4 + fVar6 + fVar4;
  fVar6 = fVar6 + fVar12;
  fVar3 = fVar3 + fVar6;
  fVar12 = (float)local_28._0_4_ * 0.0 + local_4c * 0.0 + local_48 + 0.0;
  fVar13 = local_40 * 0.0 + local_44 * 0.0 + local_64 + 0.0;
  local_38._0_4_ = (float)local_38._0_4_ * 0.0 + local_3c + 0.0;
  fVar4 = (fVar6 + fVar4) * 0.0;
  local_28._0_4_ = (float)local_28._0_4_ * fVar3 + local_48 * fVar11 + local_4c * fVar14 + fVar4;
  local_64 = fVar3 * local_40 + fVar11 * local_64 + fVar14 * local_44 + fVar4;
  fVar3 = fVar12 * fVar12 + fVar13 * fVar13;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = atan2f(-(float)local_38._0_4_,fVar3);
  rot->y = fVar3;
  fVar3 = atan2f(-(float)local_28._0_4_,local_64);
  rot->z = fVar3;
  return;
}

Assistant:

void
extractEulerXYZ (const Matrix44<T>& mat, Vec3<T>& rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize ();
    j.normalize ();
    k.normalize ();

    Matrix44<T> M (
        i[0],
        i[1],
        i[2],
        0,
        j[0],
        j[1],
        j[2],
        0,
        k[0],
        k[1],
        k[2],
        0,
        0,
        0,
        0,
        1);

    //
    // Extract the first angle, rot.x.
    //

    rot.x = std::atan2 (M[1][2], M[2][2]);

    //
    // Remove the rot.x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (-rot.x, 0, 0));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy  = std::sqrt (N[0][0] * N[0][0] + N[0][1] * N[0][1]);
    rot.y = std::atan2 (-N[0][2], cy);
    rot.z = std::atan2 (-N[1][0], N[1][1]);
}